

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.cpp
# Opt level: O3

int set(node *table,char *key,char *data)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = lookup(table,key);
  if (iVar1 == 0) {
    uVar2 = hash(key,0x1e);
    strcpy(table[uVar2].key,key);
    strcpy(table[uVar2].data,data);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

int set(node *table, const char *key,const char *data)
{
    if( !lookup(table, key) )
    {
        // Поиск необходимого связанного списка
        unsigned index = hash(key, TABLESIZE);
        //table[index] = (node *)mmap(0,1024,
          //                          prot,flag,-1,0);

        //node *new_node= (node *)mmap(0,1024,prot,flag,-1,0);
        //new_node->key = (char*)key;
       // new_node->data = (char*)data;

        //new_node.next = table[index];
        strcpy(table[index].key, key);
        strcpy(table[index].data, data);

        // Добавление нового ключа и обновление указателя на начало связанного списка
        return 1;
    }
    return 0;
}